

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Format.h
# Opt level: O0

string * __thiscall
adapt::cuf::Format<double,double,std::__cxx11::string>
          (string *__return_storage_ptr__,cuf *this,string *format,double *values,double *values_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *values_2)

{
  const_iterator local_40;
  const_iterator itend;
  const_iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *values_local_2;
  double *values_local_1;
  double *values_local;
  string *format_local;
  string *result;
  
  itend._M_current = (char *)std::__cxx11::string::begin();
  local_40._M_current = (char *)std::__cxx11::string::end();
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  detail::Format_impl<double,double,std::__cxx11::string>
            (__return_storage_ptr__,&itend,&local_40,(double *)format,values,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)values_1);
  return __return_storage_ptr__;
}

Assistant:

std::string Format(const std::string& format, const Values& ...values)
{
	std::string::const_iterator it = format.begin();
	std::string::const_iterator itend = format.end();
	std::string result;
	detail::Format_impl(result, it, itend, values...);
	return result;
}